

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemSubroutine.h
# Opt level: O3

void __thiscall slang::ast::SystemSubroutine::~SystemSubroutine(SystemSubroutine *this)

{
  pointer p;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  
  this->_vptr_SystemSubroutine = (_func_int **)&PTR__SystemSubroutine_005ec008;
  p = (this->name)._M_dataplus._M_p;
  paVar1 = &(this->name).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)p != paVar1) {
    operator_delete(p,paVar1->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

virtual ~SystemSubroutine() = default;